

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O1

int zt_ptr_array_cat(zt_ptr_array *dst,zt_ptr_array *src)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if (src != (zt_ptr_array *)0x0 && dst != (zt_ptr_array *)0x0) {
    if (0 < src->count) {
      lVar2 = 0;
      do {
        iVar1 = zt_ptr_array_add(dst,src->array[lVar2]);
        if (iVar1 != 0) {
          return -1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < src->count);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
zt_ptr_array_cat(zt_ptr_array * dst, zt_ptr_array * src) {
    int32_t i;

    if (dst == NULL || src == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        if (zt_ptr_array_add(dst, zt_ptr_array_get_idx(src, i))) {
            return -1;
        }
    }

    return 0;
}